

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O0

int fl_height(int font,int size)

{
  Fl_Font FVar1;
  Fl_Fontsize FVar2;
  int iVar3;
  int height;
  int ts;
  int tf;
  int size_local;
  int font_local;
  
  FVar1 = fl_font();
  if ((font == FVar1) && (FVar2 = fl_size(), size == FVar2)) {
    iVar3 = fl_height();
    return iVar3;
  }
  FVar1 = fl_font();
  FVar2 = fl_size();
  fl_font(font,size);
  iVar3 = fl_height();
  fl_font(FVar1,FVar2);
  return iVar3;
}

Assistant:

int fl_height(int font, int size) {
    if ( font == fl_font() && size == fl_size() ) return(fl_height());
    int tf = fl_font(), ts = fl_size();   // save
    fl_font(font,size);
    int height = fl_height();
    fl_font(tf,ts);                       // restore
    return(height);
}